

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O0

String * __thiscall stick::ArgumentParser::help(String *__return_storage_ptr__,ArgumentParser *this)

{
  Size SVar1;
  Allocator *pAVar2;
  String local_110;
  String local_f0;
  Argument *local_c8;
  Argument *arg_1;
  ConstIter __end3_1;
  ConstIter __begin3_1;
  ArgumentArray *__range3_1;
  String local_88;
  Argument *local_60;
  Argument *arg;
  ConstIter __end3;
  ConstIter __begin3;
  ArgumentArray *__range3;
  undefined1 local_19;
  ArgumentParser *local_18;
  ArgumentParser *this_local;
  String *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ArgumentParser *)__return_storage_ptr__;
  usage(__return_storage_ptr__,this);
  SVar1 = String::length(&this->m_info);
  if (SVar1 != 0) {
    String::String((String *)&__range3,&this->m_info);
    String::append<char_const*,stick::String,char_const*>(__return_storage_ptr__,"\n",&__range3);
    String::~String((String *)&__range3);
  }
  SVar1 = DynamicArray<stick::ArgumentParser::Argument>::count(&this->m_args);
  if (SVar1 != 0) {
    if (this->m_requiredCount != 0) {
      String::append(__return_storage_ptr__,"\nRequired arguments:\n");
      __begin3 = (ConstIter)&this->m_args;
      __end3 = DynamicArray<stick::ArgumentParser::Argument>::begin
                         ((DynamicArray<stick::ArgumentParser::Argument> *)__begin3);
      arg = DynamicArray<stick::ArgumentParser::Argument>::end
                      ((DynamicArray<stick::ArgumentParser::Argument> *)__begin3);
      for (; __end3 != arg; __end3 = __end3 + 1) {
        local_60 = __end3;
        if ((__end3->bOptional & 1U) == 0) {
          SVar1 = String::length(&__end3->shortName);
          if (SVar1 != 0) {
            String::append(__return_storage_ptr__,&local_60->shortName);
          }
          SVar1 = String::length(&local_60->name);
          if (SVar1 != 0) {
            SVar1 = String::length(&local_60->shortName);
            if (SVar1 != 0) {
              String::append(__return_storage_ptr__,", ");
            }
            String::append(__return_storage_ptr__,&local_60->name);
          }
          detail::argumentSignature(&local_88,local_60);
          SVar1 = String::length(&local_60->info);
          if (SVar1 == 0) {
            pAVar2 = defaultAllocator();
            String::String((String *)&__range3_1,"",pAVar2);
          }
          else {
            String::String((String *)&__range3_1,&local_60->info);
          }
          String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                    (__return_storage_ptr__," ",&local_88,"    ",&__range3_1,"\n");
          String::~String((String *)&__range3_1);
          String::~String(&local_88);
        }
      }
      String::append(__return_storage_ptr__,"\n");
    }
    SVar1 = DynamicArray<stick::ArgumentParser::Argument>::count(&this->m_args);
    if (this->m_requiredCount < SVar1) {
      String::append(__return_storage_ptr__,"Optional arguments:\n");
      __begin3_1 = (ConstIter)&this->m_args;
      __end3_1 = DynamicArray<stick::ArgumentParser::Argument>::begin
                           ((DynamicArray<stick::ArgumentParser::Argument> *)__begin3_1);
      arg_1 = DynamicArray<stick::ArgumentParser::Argument>::end
                        ((DynamicArray<stick::ArgumentParser::Argument> *)__begin3_1);
      for (; __end3_1 != arg_1; __end3_1 = __end3_1 + 1) {
        local_c8 = __end3_1;
        if ((__end3_1->bOptional & 1U) != 0) {
          SVar1 = String::length(&__end3_1->shortName);
          if (SVar1 != 0) {
            String::append(__return_storage_ptr__,&local_c8->shortName);
          }
          SVar1 = String::length(&local_c8->name);
          if (SVar1 != 0) {
            SVar1 = String::length(&local_c8->shortName);
            if (SVar1 != 0) {
              String::append(__return_storage_ptr__,", ");
            }
            String::append(__return_storage_ptr__,&local_c8->name);
          }
          detail::argumentSignature(&local_f0,local_c8);
          SVar1 = String::length(&local_c8->info);
          if (SVar1 == 0) {
            pAVar2 = defaultAllocator();
            String::String(&local_110,"",pAVar2);
          }
          else {
            String::String(&local_110,&local_c8->info);
          }
          String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                    (__return_storage_ptr__," ",&local_f0,"    ",&local_110,"\n");
          String::~String(&local_110);
          String::~String(&local_f0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String ArgumentParser::help() const
{
    String ret = usage();

    if (m_info.length())
        ret.append(AppendVariadicFlag(), "\n", m_info, "\n");

    if (m_args.count())
    {
        if (m_requiredCount)
        {
            ret.append("\nRequired arguments:\n");
            for (auto & arg : m_args)
            {
                if (!arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
            ret.append("\n");
        }
        if (m_args.count() > m_requiredCount)
        {
            ret.append("Optional arguments:\n");
            for (auto & arg : m_args)
            {
                if (arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
        }
    }

    return ret;
}